

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O2

void canvas_displaceselection(_glist *x,int dx,int dy)

{
  t_selection *ptVar1;
  t_pd p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  void *data;
  t_editor *ptVar6;
  t_selection **pptVar7;
  
  ptVar6 = x->gl_editor;
  if ((ptVar6->e_selection != (t_selection *)0x0) &&
     (*(int *)((pd_maininstance.pd_gui)->i_editor + 0x40) == 0)) {
    data = canvas_undo_set_move(x,1);
    canvas_undo_add(x,UNDO_MOTION,"motion",data);
    *(undefined4 *)((pd_maininstance.pd_gui)->i_editor + 0x40) = 1;
    ptVar6 = x->gl_editor;
  }
  bVar3 = false;
  bVar4 = false;
  pptVar7 = &ptVar6->e_selection;
  while (ptVar1 = *pptVar7, ptVar1 != (t_selection *)0x0) {
    p_Var2 = ptVar1->sel_what->g_pd;
    gobj_displace(ptVar1->sel_what,x,dx,dy);
    bVar5 = true;
    if (p_Var2 != voutlet_class) {
      bVar5 = bVar4;
    }
    if (p_Var2 == vinlet_class) {
      bVar3 = true;
      bVar5 = bVar4;
    }
    bVar4 = bVar5;
    pptVar7 = &ptVar1->sel_next;
  }
  if (bVar3) {
    canvas_resortinlets(x);
  }
  if (bVar4) {
    canvas_resortoutlets(x);
  }
  pdgui_vmess("pdtk_canvas_getscroll","c",x);
  if (x->gl_editor->e_selection != (t_selection *)0x0) {
    canvas_dirty(x,1.0);
    return;
  }
  return;
}

Assistant:

static void canvas_displaceselection(t_canvas *x, int dx, int dy)
{
    t_selection *y;
    int resortin = 0, resortout = 0;
    if (x->gl_editor->e_selection && !EDITOR->canvas_undo_already_set_move)
    {
        canvas_undo_add(x, UNDO_MOTION, "motion", canvas_undo_set_move(x, 1));
        EDITOR->canvas_undo_already_set_move = 1;
    }
    for (y = x->gl_editor->e_selection; y; y = y->sel_next)
    {
        t_class *cl = pd_class(&y->sel_what->g_pd);
        gobj_displace(y->sel_what, x, dx, dy);
        if (cl == vinlet_class) resortin = 1;
        else if (cl == voutlet_class) resortout = 1;
    }
    if (resortin) canvas_resortinlets(x);
    if (resortout) canvas_resortoutlets(x);
    pdgui_vmess("pdtk_canvas_getscroll", "c", x);
    if (x->gl_editor->e_selection)
        canvas_dirty(x, 1);
}